

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,FunctionCallStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  element_type *var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  StmtException *this_01;
  string_view sVar5;
  initializer_list<kratos::IRNode_*> __l;
  FunctionCallStmt *local_78;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_70;
  string local_58;
  allocator_type local_31;
  
  iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[4])(stmt);
  if (*(int *)(CONCAT44(extraout_var,iVar3) + 0x48) == 2) {
    if (this->generator_->debug == true) {
      (stmt->super_Stmt).super_IRNode.verilog_ln =
           *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
    }
    puVar1 = &(this->stream_).super_stringstream.field_0x10;
    sVar5 = indent(this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar5._M_str,sVar5._M_len);
    var = (stmt->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr;
    this_00 = (stmt->var_).super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    Stream::var_str_abi_cxx11_(&local_58,&this->stream_,&var->super_Var);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,";",1);
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    local_58._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_58,1);
    return;
  }
  this_01 = (StmtException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Function call statement cannot be used in top level","");
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  local_78 = stmt;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_70,__l,&local_31);
  StmtException::StmtException(this_01,&local_58,&local_70);
  __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SystemVerilogCodeGen::stmt_code(kratos::FunctionCallStmt* stmt) {
    // since this is a statement, we don't allow it has return value
    // need to use it as a function call expr instead
    if (stmt->parent()->ir_node_kind() != IRNodeKind::StmtKind) {
        throw StmtException("Function call statement cannot be used in top level", {stmt});
    }
    if (generator_->debug) stmt->verilog_ln = stream_.line_no();
    stream_ << indent() << stream_.var_str(stmt->var());

    stream_ << ";" << stream_.endl();
}